

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.cpp
# Opt level: O1

GMM_STATUS __thiscall
GmmLib::PageTable::AllocateL3Table(PageTable *this,uint32_t L3TableSize,uint32_t L3AddrAlignment)

{
  int i;
  GMM_STATUS GVar1;
  long lVar2;
  undefined1 auStack_58 [8];
  GMM_DEVICE_ALLOC Alloc;
  
  Alloc.CPUVA = 0;
  Alloc.Priv = (void *)0x0;
  Alloc.Handle = (HANDLE)0x0;
  Alloc.GfxVA = 0;
  auStack_58._0_4_ = 0;
  auStack_58._4_4_ = 0;
  Alloc.Size = 0;
  Alloc.Alignment = 0;
  if (this->PageTableMgr == (GmmPageTableMgr *)0x0) {
    GVar1 = GMM_INVALIDPARAM;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&this->TTLock);
    auStack_58._4_4_ = L3AddrAlignment;
    auStack_58._0_4_ = L3TableSize;
    Alloc.Priv = this->PageTableMgr->hCsr;
    GVar1 = __GmmDeviceAlloc(this->pClientContext,&this->PageTableMgr->DeviceCbInt,
                             (GMM_DEVICE_ALLOC *)auStack_58);
    if (GVar1 == GMM_SUCCESS) {
      (this->TTL3).GfxAddress = ((long)Alloc.Handle << 0x10) >> 0x10;
      (this->TTL3).CPUAddress = Alloc.GfxVA;
      (this->TTL3).NeedRegisterUpdate = true;
      (this->TTL3).L3Handle = (HANDLE)Alloc._0_8_;
      (this->TTL3).pGmmResInfo = (GMM_RESOURCE_INFO *)Alloc.CPUVA;
      GVar1 = GMM_SUCCESS;
      lVar2 = 0;
      do {
        *(undefined8 *)((this->TTL3).CPUAddress + lVar2 * 8) = 0;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x1000);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->TTLock);
  }
  return GVar1;
}

Assistant:

GMM_STATUS GmmLib::PageTable::AllocateL3Table(uint32_t L3TableSize, uint32_t L3AddrAlignment)
{
    GMM_STATUS       Status = GMM_SUCCESS;
    GMM_DEVICE_ALLOC Alloc  = {0};

    __GMM_ASSERTPTR(PageTableMgr, GMM_INVALIDPARAM);

    EnterCriticalSection(&TTLock);

    Alloc.Size      = L3TableSize;
    Alloc.Alignment = L3AddrAlignment;
    Alloc.hCsr      = PageTableMgr->hCsr;

    Status = __GmmDeviceAlloc(pClientContext, &PageTableMgr->DeviceCbInt, &Alloc);
    if(Status != GMM_SUCCESS)
    {
        LeaveCriticalSection(&TTLock);
        return Status;
    }

    TTL3.GfxAddress         = GMM_GFX_ADDRESS_CANONIZE(Alloc.GfxVA);
    TTL3.CPUAddress         = Alloc.CPUVA;
    TTL3.NeedRegisterUpdate = true;
    TTL3.L3Handle           = (HANDLE)(uintptr_t)Alloc.Handle;
    TTL3.pGmmResInfo        = (GMM_RESOURCE_INFO *)Alloc.Priv;

    // Invalidate L3e's
    for(int i = 0; i < (GMM_L3_SIZE(TTType)); i++)
    {
        //initialize L3e ie mark all entries with Null tile/invalid value
        ((GMM_AUXTTL3e *)TTL3.CPUAddress)[i].Value = 0;

    }

    LeaveCriticalSection(&TTLock);
    return Status;
}